

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::UnifiedCache::setEvictionPolicy
          (UnifiedCache *this,int32_t count,int32_t percentageOfInUseItems,UErrorCode *status)

{
  Mutex lock;
  Mutex local_28;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if ((percentageOfInUseItems | count) < 0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    local_28.fMutex = &gCacheMutex;
    umtx_lock_63(&gCacheMutex);
    this->fMaxUnused = count;
    this->fMaxPercentageOfInUse = percentageOfInUseItems;
    Mutex::~Mutex(&local_28);
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }